

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler> *this
          )

{
  undefined8 uVar1;
  BinaryReaderBase *this_00;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Writer *this_01;
  ulong local_58 [4];
  ArgList local_38;
  
  iVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                    (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if (iVar2 <= **(int **)(this + 8)) {
    if (0 < iVar2) {
      do {
        uVar3 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                            *)this,**(uint **)(this + 8));
        this_00 = *(BinaryReaderBase **)this;
        (this_00->super_ReaderBase).token_ = (this_00->super_ReaderBase).ptr_;
        pcVar4 = BinaryReaderBase::Read(this_00,8);
        uVar1 = *(undefined8 *)pcVar4;
        this_01 = TestNLHandler::WriteSep(*(TestNLHandler **)(this + 0x10));
        local_58[0] = (ulong)uVar3;
        local_58[2] = uVar1;
        fmt::BasicWriter<char>::write(this_01,0x26a1c6,(void *)0x82,(size_t)local_58);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  local_38.field_1.values_ = (Value *)local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_38.types_ = 0;
  BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x2658be,&local_38);
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}